

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPartialsPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,int startPattern,int endPattern)

{
  double *pdVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int k;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  
  auVar5 = vpmovsxbq_avx(ZEXT216(0xa05));
  auVar6 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
  auVar8 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
  uVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  uVar17 = (ulong)(uint)startPattern;
  iVar16 = startPattern * 4;
  uVar18 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
  for (uVar20 = 0; uVar20 != (~((int)uVar3 >> 0x1f) & uVar3); uVar20 = uVar20 + 1) {
    lVar21 = (long)iVar16 << 3;
    auVar22 = vpbroadcastq_avx512vl();
    lVar19 = uVar20 * 0x14 + 0xf;
    auVar4 = vpaddq_avx(auVar22._0_16_,auVar5);
    auVar23 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar22,auVar6);
    vpaddq_avx2(auVar22,auVar7);
    vpaddq_avx2(auVar22,auVar8);
    auVar24 = vpermq_avx2(ZEXT1632(auVar4),0xd0);
    auVar24 = vpblendd_avx2(auVar24,auVar22,3);
    vpblendd_avx2(auVar24,auVar23,0xc0);
    auVar24 = vgatherqpd_avx512vl(matrices1[(long)matrices2]);
    auVar22 = vgatherqpd_avx512vl(matrices1[uVar17]);
    auVar23 = vgatherqpd_avx512vl(matrices1[uVar18]);
    auVar25 = vgatherqpd_avx512vl(matrices1[lVar19]);
    auVar26 = vgatherqpd_avx512vl(*(undefined8 *)((long)matrices2 * 9));
    auVar27 = vgatherqpd_avx512vl(matrices2[uVar17]);
    auVar28 = vgatherqpd_avx512vl(matrices2[uVar18]);
    auVar29 = vgatherqpd_avx512vl(matrices2[lVar19]);
    uVar15 = uVar17;
    while ((int)uVar15 < endPattern) {
      uVar2 = *(undefined8 *)((long)partials1 + lVar21 + 8);
      auVar30._8_8_ = uVar2;
      auVar30._0_8_ = uVar2;
      auVar30._16_8_ = uVar2;
      auVar30._24_8_ = uVar2;
      auVar30 = vmulpd_avx512vl(auVar22,auVar30);
      uVar2 = *(undefined8 *)((long)partials2 + lVar21 + 8);
      auVar31._8_8_ = uVar2;
      auVar31._0_8_ = uVar2;
      auVar31._16_8_ = uVar2;
      auVar31._24_8_ = uVar2;
      auVar31 = vmulpd_avx512vl(auVar27,auVar31);
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar2 = *(undefined8 *)((long)partials1 + lVar21);
      auVar9._8_8_ = uVar2;
      auVar9._0_8_ = uVar2;
      auVar9._16_8_ = uVar2;
      auVar9._24_8_ = uVar2;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar24,auVar9);
      uVar2 = *(undefined8 *)((long)partials2 + lVar21);
      auVar10._8_8_ = uVar2;
      auVar10._0_8_ = uVar2;
      auVar10._16_8_ = uVar2;
      auVar10._24_8_ = uVar2;
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar26,auVar10);
      uVar2 = *(undefined8 *)((long)partials1 + lVar21 + 0x10);
      auVar11._8_8_ = uVar2;
      auVar11._0_8_ = uVar2;
      auVar11._16_8_ = uVar2;
      auVar11._24_8_ = uVar2;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar23,auVar11);
      uVar2 = *(undefined8 *)((long)partials2 + lVar21 + 0x10);
      auVar12._8_8_ = uVar2;
      auVar12._0_8_ = uVar2;
      auVar12._16_8_ = uVar2;
      auVar12._24_8_ = uVar2;
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar28,auVar12);
      uVar2 = *(undefined8 *)((long)partials1 + lVar21 + 0x18);
      auVar13._8_8_ = uVar2;
      auVar13._0_8_ = uVar2;
      auVar13._16_8_ = uVar2;
      auVar13._24_8_ = uVar2;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar25,auVar13);
      uVar2 = *(undefined8 *)((long)partials2 + lVar21 + 0x18);
      auVar14._8_8_ = uVar2;
      auVar14._0_8_ = uVar2;
      auVar14._16_8_ = uVar2;
      auVar14._24_8_ = uVar2;
      auVar31 = vfmadd231pd_avx512vl(auVar31,auVar29,auVar14);
      pdVar1 = (double *)((long)destP + lVar21);
      *pdVar1 = auVar30._0_8_ * auVar31._0_8_;
      pdVar1[1] = auVar30._8_8_ * auVar31._8_8_;
      pdVar1[2] = auVar30._16_8_ * auVar31._16_8_;
      pdVar1[3] = auVar30._24_8_ * auVar31._24_8_;
      lVar21 = lVar21 + 0x20;
    }
    iVar16 = iVar16 + uVar18;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            u += 4;

        }
    }
}